

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O0

int ncnn::convolution_im2col_gemm
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int kernel_w,int kernel_h,
              int dilation_w,int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000030;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  int max_jj_1;
  int j_1;
  int max_ii;
  Mat topT_tile;
  int i;
  int ppj_1;
  Mat topT_tileX;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int N;
  int M;
  int maxk;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined1 in_stack_00000f53;
  int in_stack_00000f54;
  Mat *in_stack_00000f58;
  Mat *in_stack_00000f60;
  Mat *in_stack_00000f68;
  Mat *in_stack_00000f70;
  Mat *in_stack_00000f78;
  undefined4 in_stack_fffffffffffff500;
  undefined4 in_stack_fffffffffffff504;
  undefined4 in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff50c;
  int in_stack_fffffffffffff514;
  int in_stack_fffffffffffff518;
  int in_stack_fffffffffffff51c;
  Mat *in_stack_fffffffffffff520;
  void **ppvVar2;
  Mat *in_stack_fffffffffffff528;
  int *in_stack_fffffffffffff540;
  int *in_stack_fffffffffffff548;
  int in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  undefined8 in_stack_fffffffffffff558;
  undefined8 in_stack_fffffffffffff560;
  undefined8 in_stack_fffffffffffff568;
  undefined8 in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff578;
  undefined8 local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined4 local_970;
  long *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined8 local_948;
  void *local_940;
  int *local_938;
  long local_930;
  undefined4 local_928;
  long *local_920;
  undefined4 local_918;
  int local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  long local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0;
  long *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined8 local_8b8;
  void *local_8b0;
  int *local_8a8;
  long local_8a0;
  undefined4 local_898;
  long *local_890;
  undefined4 local_888;
  int local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  long local_870;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  void *local_848;
  int *local_840;
  ulong local_838;
  undefined4 local_830;
  long *local_828;
  int local_820;
  int local_81c;
  int local_818;
  undefined4 local_814;
  undefined4 local_810;
  ulong local_808;
  void *local_800;
  int *local_7f8;
  void *local_7f0;
  undefined4 local_7e8;
  long *local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  void *local_7c0;
  int local_7b8;
  int local_7b4;
  void *local_7b0;
  int *local_7a8;
  ulong local_7a0;
  undefined4 local_798;
  long *local_790;
  int local_788;
  int local_784;
  int local_780;
  undefined4 local_77c;
  int local_778;
  long local_770;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined4 local_750;
  long *local_748;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined8 local_728;
  void *local_720;
  int *local_718;
  long local_710;
  undefined4 local_708;
  long *local_700;
  undefined4 local_6f8;
  int local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  long local_6e0;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  undefined4 local_6b0;
  void *local_6a0;
  int *local_698;
  long local_690;
  undefined4 local_688;
  long *local_680;
  undefined4 local_678;
  int local_674;
  int local_670;
  undefined4 local_66c;
  int local_668;
  long local_660;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  long *local_620;
  int local_604;
  void **local_600;
  void **local_5f8;
  undefined8 *local_5f0;
  void **local_5e0;
  void **local_5d0;
  undefined8 *local_5c0;
  undefined8 *local_5b0;
  void **local_5a0;
  void **local_590;
  void **local_580;
  void **local_570;
  void **local_560;
  void **local_548;
  void **local_540;
  void **local_538;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  int local_510;
  undefined4 local_50c;
  void **local_508;
  int local_4f0;
  undefined4 local_4ec;
  void **local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  int local_4b0;
  undefined4 local_4ac;
  void **local_4a8;
  int local_490;
  undefined4 local_48c;
  void **local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  int local_410;
  undefined4 local_40c;
  void **local_408;
  undefined8 *local_3e8;
  void **local_3e0;
  void **local_3d8;
  undefined1 local_3cd;
  int local_3cc;
  void **local_3c8;
  undefined8 *local_3c0;
  undefined1 local_39d;
  int local_39c;
  void **local_398;
  void **local_390;
  undefined1 local_36d;
  int local_36c;
  void **local_368;
  undefined8 *local_360;
  undefined1 local_33d;
  int local_33c;
  undefined8 *local_330;
  void *local_2e0;
  void *local_2d0;
  void *local_2a0;
  void *local_290;
  void *local_280;
  void *local_270;
  void *local_260;
  void *local_250;
  undefined8 local_248;
  undefined8 local_240;
  int local_234;
  int local_230;
  int local_22c;
  void **local_228;
  undefined4 local_220;
  int local_21c;
  undefined8 *local_218;
  void **local_210;
  long *local_208;
  undefined4 local_1fc;
  long local_1f8;
  void *local_1f0;
  undefined4 local_1e8;
  int local_1e4;
  void **local_1e0;
  undefined4 local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  void **local_1c8;
  long *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  int local_19c;
  void **local_198;
  void **local_190;
  void **local_188;
  undefined4 local_180;
  int local_17c;
  undefined8 *local_178;
  void **local_170;
  long *local_168;
  undefined4 local_15c;
  long local_158;
  void *local_150;
  undefined4 local_148;
  int local_144;
  void **local_140;
  long *local_138;
  undefined4 local_12c;
  long local_128;
  long local_120;
  undefined4 local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  long *local_100;
  undefined4 local_f4;
  long local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 *local_d0;
  long *local_c8;
  undefined4 local_bc;
  ulong local_b8;
  void *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  void **local_98;
  long *local_90;
  undefined4 local_84;
  long local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_44;
  long local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  
  local_634 = in_R8D * in_R9D;
  local_638 = *(int *)(in_RSI + 0x38) * *(int *)(in_RSI + 0x18);
  local_63c = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x30);
  local_640 = *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x18) * local_634;
  local_620 = in_RDX;
  convolution_im2col_gemm_get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff560 >> 0x20),(int)in_stack_fffffffffffff560,
             (int)((ulong)in_stack_fffffffffffff558 >> 0x20),
             (int *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
             in_stack_fffffffffffff548,in_stack_fffffffffffff540,(int)in_stack_fffffffffffff570);
  local_650 = (local_638 + local_644 + -1) / local_644;
  local_654 = (local_63c + local_648 + -1) / local_648;
  local_658 = (local_640 + local_64c + -1) / local_64c;
  local_22c = local_64c * local_648;
  local_230 = (local_640 + local_64c + -1) / local_64c;
  local_234 = (local_63c + local_648 + -1) / local_648;
  local_248 = *(undefined8 *)(in_stack_00000030 + 0x10);
  local_228 = &local_6a0;
  local_240 = 4;
  local_6a0 = (void *)0x0;
  local_698 = (int *)0x0;
  local_690 = 0;
  local_688 = 0;
  local_680 = (long *)0x0;
  local_678 = 0;
  local_674 = 0;
  local_670 = 0;
  local_66c = 0;
  local_668 = 0;
  local_660 = 0;
  Mat::create(in_stack_fffffffffffff520,in_stack_fffffffffffff51c,in_stack_fffffffffffff518,
              in_stack_fffffffffffff514,
              CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
              (Allocator *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
  local_3d8 = &local_6a0;
  if (local_6a0 != (void *)0x0) {
    local_190 = local_3d8;
  }
  if (local_6a0 == (void *)0x0 || local_660 * local_668 == 0) {
    local_604 = -100;
    local_6b0 = 1;
    goto LAB_0062e57d;
  }
  local_6b4 = local_654 * local_658;
  for (local_6b8 = 0; local_6b8 < local_6b4; local_6b8 = local_6b8 + 1) {
    local_6bc = local_6b8 / local_658;
    local_6c0 = local_6b8 % local_658;
    local_6c4 = local_6bc * local_648;
    local_6c8 = local_6c0 * local_64c;
    local_6d0 = local_63c - local_6c4;
    piVar1 = std::min<int>(&local_6d0,&local_648);
    local_6cc = *piVar1;
    local_6d8 = local_640 - local_6c8;
    piVar1 = std::min<int>(&local_6d8,&local_64c);
    local_6d4 = *piVar1;
    local_36c = local_6c4 / local_648;
    local_360 = &local_768;
    local_368 = &local_6a0;
    local_e8 = (void *)((long)local_6a0 + local_660 * local_36c * local_690);
    local_d0 = &local_768;
    local_30 = (long)local_674 * (long)local_670 * local_690;
    local_1d4 = local_6c8 / local_64c;
    local_1c8 = &local_720;
    local_1d0 = &local_768;
    local_1a8 = (void *)((long)local_e8 + (long)local_674 * (long)local_1d4 * local_690);
    local_198 = &local_720;
    local_6e0 = (long)local_674;
    local_5f0 = &local_768;
    local_6e8 = 1;
    local_6ec = 1;
    local_6f0 = 1;
    local_6f4 = local_674;
    local_6f8 = 2;
    local_700 = local_680;
    local_708 = local_688;
    local_710 = local_690;
    local_718 = (int *)0x0;
    local_748 = local_680;
    local_34 = 0x10;
    local_d4 = local_674;
    local_d8 = local_670;
    local_dc = local_66c;
    local_f0 = local_690;
    local_f4 = local_688;
    local_100 = local_680;
    local_19c = local_674;
    local_1a0 = 1;
    local_1b0 = local_690;
    local_1b4 = local_688;
    local_1c0 = local_680;
    local_1d8 = 1;
    local_36d = 1;
    local_768 = 0;
    local_758 = 0;
    local_750 = 0;
    local_740 = 0;
    local_73c = 0;
    local_738 = 0;
    local_734 = 0;
    local_730 = 0;
    local_728 = 0;
    local_760 = 0;
    in_stack_fffffffffffff500 = in_stack_00000010;
    in_stack_fffffffffffff508 = in_stack_00000018;
    local_3e8 = local_5f0;
    local_720 = local_1a8;
    convolution_im2col_input_tile
              (in_stack_fffffffffffff528,in_stack_fffffffffffff520,in_stack_fffffffffffff51c,
               in_stack_fffffffffffff518,in_stack_fffffffffffff514,in_stack_00000020,
               in_stack_fffffffffffff550,(int)in_stack_fffffffffffff558,
               (int)in_stack_fffffffffffff560,(int)in_stack_fffffffffffff568,
               (int)in_stack_fffffffffffff570,(int)in_stack_fffffffffffff578);
    local_5e0 = &local_720;
    local_408 = local_5e0;
    if (local_718 != (int *)0x0) {
      local_40c = 0xffffffff;
      LOCK();
      local_410 = *local_718;
      *local_718 = *local_718 + -1;
      UNLOCK();
      if (local_410 == 1) {
        if (local_700 == (long *)0x0) {
          local_2e0 = local_720;
          if (local_720 != (void *)0x0) {
            free(local_720);
          }
        }
        else {
          (**(code **)(*local_700 + 0x18))(local_700,local_720);
        }
      }
    }
    local_720 = (void *)0x0;
    local_710 = 0;
    local_708 = 0;
    local_6f8 = 0;
    local_6f4 = 0;
    local_6f0 = 0;
    local_6ec = 0;
    local_6e8 = 0;
    local_6e0 = 0;
    local_718 = (int *)0x0;
  }
  local_600 = &local_7b0;
  local_7b0 = (void *)0x0;
  local_7a8 = (int *)0x0;
  local_7a0 = 0;
  local_798 = 0;
  local_790 = (long *)0x0;
  local_788 = 0;
  local_784 = 0;
  local_780 = 0;
  local_77c = 0;
  local_778 = 0;
  local_770 = 0;
  if (local_64c < local_640) {
    Mat::create(in_stack_fffffffffffff520,in_stack_fffffffffffff51c,in_stack_fffffffffffff518,
                in_stack_fffffffffffff514,
                CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                (Allocator *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
    local_3e0 = &local_7b0;
    if (local_7b0 != (void *)0x0) {
      local_188 = local_3e0;
    }
    if (local_7b0 != (void *)0x0 && local_770 * local_778 != 0) goto LAB_0062c7aa;
    local_604 = -100;
  }
  else {
LAB_0062c7aa:
    for (local_7b4 = 0; local_7b4 < local_650; local_7b4 = local_7b4 + 1) {
      local_7b8 = local_7b4 * local_644;
      local_5f8 = &local_800;
      local_800 = (void *)0x0;
      local_7f8 = (int *)0x0;
      local_7f0 = (void *)0x0;
      local_7e8 = 0;
      local_7e0 = (long *)0x0;
      local_7d8 = 0;
      local_7d4 = 0;
      local_7d0 = 0;
      local_7cc = 0;
      local_7c8 = 0;
      local_7c0 = (void *)0x0;
      if (local_64c < local_640) {
        local_39c = get_omp_thread_num();
        local_390 = &local_848;
        local_398 = &local_7b0;
        local_b0 = (void *)((long)local_7b0 + local_770 * local_39c * local_7a0);
        local_98 = &local_848;
        local_848 = local_b0;
        local_840 = (int *)0x0;
        local_838 = local_7a0;
        local_830 = local_798;
        local_828 = local_790;
        local_81c = local_784;
        local_818 = local_780;
        local_814 = 1;
        local_810 = local_77c;
        local_40 = (long)local_784 * (long)local_780 * local_7a0;
        local_808 = (local_40 + 0xfU & 0xfffffffffffffff0) / local_7a0;
        local_820 = local_788 + -1;
        if (local_788 == 4) {
          local_808 = (long)local_784 * (long)local_780;
        }
        local_44 = 0x10;
        local_9c = local_784;
        local_a0 = local_780;
        local_a4 = local_77c;
        local_b8 = local_7a0;
        local_bc = local_798;
        local_c8 = local_790;
        local_39d = 1;
        local_548 = &local_848;
        local_540 = &local_800;
        if (&local_800 != local_548) {
          local_528 = &local_800;
          if (local_7f8 != (int *)0x0) {
            local_52c = 0xffffffff;
            LOCK();
            local_530 = *local_7f8;
            *local_7f8 = *local_7f8 + -1;
            UNLOCK();
            if (local_530 == 1) {
              if (local_7e0 == (long *)0x0) {
                local_250 = local_800;
                if (local_800 != (void *)0x0) {
                  free(local_800);
                }
              }
              else {
                (**(code **)(*local_7e0 + 0x18))(local_7e0,local_800);
              }
            }
          }
          local_800 = (void *)0x0;
          local_7f0 = (void *)0x0;
          local_7e8 = 0;
          local_7d8 = 0;
          local_7d4 = 0;
          local_7d0 = 0;
          local_7cc = 0;
          local_7c8 = 0;
          local_7c0 = (void *)0x0;
          local_7f8 = (int *)0x0;
          local_800 = *local_548;
          local_7f8 = (int *)local_548[1];
          local_7f0 = local_548[2];
          local_7e8 = *(undefined4 *)(local_548 + 3);
          local_7e0 = (long *)local_548[4];
          local_7d8 = *(undefined4 *)(local_548 + 5);
          local_7d4 = *(undefined4 *)((long)local_548 + 0x2c);
          local_7d0 = *(undefined4 *)(local_548 + 6);
          local_7cc = *(undefined4 *)((long)local_548 + 0x34);
          local_7c8 = *(undefined4 *)(local_548 + 7);
          local_7c0 = local_548[8];
        }
        local_5d0 = &local_848;
        local_538 = &local_800;
        local_428 = local_5d0;
        if (local_840 != (int *)0x0) {
          local_42c = 0xffffffff;
          LOCK();
          local_430 = *local_840;
          *local_840 = *local_840 + -1;
          UNLOCK();
          if (local_430 == 1) {
            if (local_828 == (long *)0x0) {
              local_2d0 = local_848;
              if (local_848 != (void *)0x0) {
                free(local_848);
              }
            }
            else {
              (**(code **)(*local_828 + 0x18))(local_828,local_848);
            }
          }
        }
        local_848 = (void *)0x0;
        local_838 = 0;
        local_830 = 0;
        local_820 = 0;
        local_81c = 0;
        local_818 = 0;
        local_814 = 0;
        local_810 = 0;
        local_808 = 0;
        local_840 = (int *)0x0;
      }
      local_850 = local_638 - local_7b8;
      piVar1 = std::min<int>(&local_850,&local_644);
      local_84c = *piVar1;
      for (local_854 = 0; local_854 < local_63c; local_854 = local_648 + local_854) {
        local_85c = local_63c - local_854;
        piVar1 = std::min<int>(&local_85c,&local_648);
        local_858 = *piVar1;
        for (local_860 = 0; local_860 < local_640; local_860 = local_64c + local_860) {
          local_868 = local_640 - local_860;
          piVar1 = std::min<int>(&local_868,&local_64c);
          local_864 = *piVar1;
          local_33c = local_7b8 / local_644;
          local_330 = &local_8f8;
          local_144 = *(int *)((long)local_620 + 0x2c);
          local_110 = (int)local_620[6];
          local_114 = *(undefined4 *)((long)local_620 + 0x34);
          local_120 = *local_620 + local_620[8] * (long)local_33c * local_620[2];
          local_158 = local_620[2];
          local_15c = (undefined4)local_620[3];
          local_168 = (long *)local_620[4];
          local_108 = &local_8f8;
          local_20 = (long)local_144 * (long)local_110 * local_158;
          local_17c = local_860 / local_64c;
          local_170 = &local_8b0;
          local_178 = &local_8f8;
          local_150 = (void *)(local_120 + (long)local_144 * (long)local_17c * local_158);
          local_140 = &local_8b0;
          local_870 = (long)local_144;
          local_5c0 = &local_8f8;
          local_3cc = local_854 / local_648;
          local_3c0 = &local_988;
          local_3c8 = &local_6a0;
          local_78 = (void *)((long)local_6a0 + local_660 * local_3cc * local_690);
          local_60 = &local_988;
          local_50 = (long)local_674 * (long)local_670 * local_690;
          local_21c = local_860 / local_64c;
          local_210 = &local_940;
          local_218 = &local_988;
          local_1f0 = (void *)((long)local_78 + (long)local_674 * (long)local_21c * local_690);
          local_1e0 = &local_940;
          local_900 = (long)local_674;
          local_5b0 = &local_988;
          local_878 = 1;
          local_87c = 1;
          local_880 = 1;
          local_888 = 2;
          local_8a8 = (int *)0x0;
          local_8c0 = 0;
          local_8c4 = 0;
          local_8c8 = 0;
          local_8cc = 0;
          local_8e0 = 0;
          local_8e8 = 0;
          local_8f0 = 0;
          local_8f8 = 0;
          local_908 = 1;
          local_90c = 1;
          local_910 = 1;
          local_914 = local_674;
          local_918 = 2;
          local_920 = local_680;
          local_928 = local_688;
          local_930 = local_690;
          local_938 = (int *)0x0;
          local_968 = local_680;
          local_24 = 0x10;
          local_54 = 0x10;
          local_64 = local_674;
          local_68 = local_670;
          local_6c = local_66c;
          local_80 = local_690;
          local_84 = local_688;
          local_90 = local_680;
          local_148 = 1;
          local_180 = 1;
          local_1e4 = local_674;
          local_1e8 = 1;
          local_1f8 = local_690;
          local_1fc = local_688;
          local_208 = local_680;
          local_220 = 1;
          local_33d = 1;
          local_3cd = 1;
          local_8b8 = 0;
          local_8d0 = 0;
          local_988 = 0;
          local_978 = 0;
          local_970 = 0;
          local_960 = 0;
          local_95c = 0;
          local_958 = 0;
          local_954 = 0;
          local_950 = 0;
          local_948 = 0;
          local_980 = 0;
          local_468 = local_5b0;
          local_448 = local_5c0;
          local_138 = local_168;
          local_12c = local_15c;
          local_128 = local_158;
          local_10c = local_144;
          local_940 = local_1f0;
          local_8d8 = local_168;
          local_8b0 = local_150;
          local_8a0 = local_158;
          local_898 = local_15c;
          local_890 = local_168;
          local_884 = local_144;
          convolution_gemm_transB_packed_tile
                    (in_stack_00000f78,in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,
                     in_stack_00000f58,in_stack_00000f54,local_854,local_858,local_860,local_864,
                     (uint)(local_640 <= local_860 + local_64c),(bool)in_stack_00000f53);
          ppvVar2 = &local_940;
          local_5a0 = ppvVar2;
          local_488 = ppvVar2;
          if (local_938 != (int *)0x0) {
            local_48c = 0xffffffff;
            LOCK();
            local_490 = *local_938;
            *local_938 = *local_938 + -1;
            UNLOCK();
            if (local_490 == 1) {
              if (local_920 == (long *)0x0) {
                local_2a0 = local_940;
                if (local_940 != (void *)0x0) {
                  free(local_940);
                }
              }
              else {
                (**(code **)(*local_920 + 0x18))(local_920,local_940);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          ppvVar2[2] = (void *)0x0;
          *(undefined4 *)(ppvVar2 + 3) = 0;
          *(undefined4 *)(ppvVar2 + 5) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
          *(undefined4 *)(ppvVar2 + 6) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
          *(undefined4 *)(ppvVar2 + 7) = 0;
          ppvVar2[8] = (void *)0x0;
          ppvVar2[1] = (void *)0x0;
          ppvVar2 = &local_8b0;
          local_590 = ppvVar2;
          local_4a8 = ppvVar2;
          if (local_8a8 != (int *)0x0) {
            local_4ac = 0xffffffff;
            LOCK();
            local_4b0 = *local_8a8;
            *local_8a8 = *local_8a8 + -1;
            UNLOCK();
            if (local_4b0 == 1) {
              if (local_890 == (long *)0x0) {
                local_290 = local_8b0;
                if (local_8b0 != (void *)0x0) {
                  free(local_8b0);
                }
              }
              else {
                (**(code **)(*local_890 + 0x18))(local_890,local_8b0);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          ppvVar2[2] = (void *)0x0;
          *(undefined4 *)(ppvVar2 + 3) = 0;
          *(undefined4 *)(ppvVar2 + 5) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
          *(undefined4 *)(ppvVar2 + 6) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
          *(undefined4 *)(ppvVar2 + 7) = 0;
          ppvVar2[8] = (void *)0x0;
          ppvVar2[1] = (void *)0x0;
        }
      }
      ppvVar2 = &local_800;
      local_580 = ppvVar2;
      local_4c8 = ppvVar2;
      if (local_7f8 != (int *)0x0) {
        local_4cc = 0xffffffff;
        LOCK();
        local_4d0 = *local_7f8;
        *local_7f8 = *local_7f8 + -1;
        UNLOCK();
        if (local_4d0 == 1) {
          if (local_7e0 == (long *)0x0) {
            local_280 = local_800;
            if (local_800 != (void *)0x0) {
              free(local_800);
            }
          }
          else {
            (**(code **)(*local_7e0 + 0x18))(local_7e0,local_800);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      ppvVar2[2] = (void *)0x0;
      *(undefined4 *)(ppvVar2 + 3) = 0;
      *(undefined4 *)(ppvVar2 + 5) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
      *(undefined4 *)(ppvVar2 + 6) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
      *(undefined4 *)(ppvVar2 + 7) = 0;
      ppvVar2[8] = (void *)0x0;
      ppvVar2[1] = (void *)0x0;
    }
    local_604 = 0;
  }
  local_6b0 = 1;
  local_570 = &local_7b0;
  local_4e8 = local_570;
  if (local_7a8 != (int *)0x0) {
    local_4ec = 0xffffffff;
    LOCK();
    local_4f0 = *local_7a8;
    *local_7a8 = *local_7a8 + -1;
    UNLOCK();
    if (local_4f0 == 1) {
      if (local_790 == (long *)0x0) {
        local_270 = local_7b0;
        if (local_7b0 != (void *)0x0) {
          free(local_7b0);
        }
      }
      else {
        (**(code **)(*local_790 + 0x18))(local_790,local_7b0);
      }
    }
  }
  local_7b0 = (void *)0x0;
  local_7a0 = 0;
  local_798 = 0;
  local_788 = 0;
  local_784 = 0;
  local_780 = 0;
  local_77c = 0;
  local_778 = 0;
  local_770 = 0;
  local_7a8 = (int *)0x0;
LAB_0062e57d:
  ppvVar2 = &local_6a0;
  if (local_698 != (int *)0x0) {
    local_50c = 0xffffffff;
    LOCK();
    local_510 = *local_698;
    *local_698 = *local_698 + -1;
    UNLOCK();
    if (local_510 == 1) {
      local_560 = ppvVar2;
      local_508 = ppvVar2;
      if (local_680 == (long *)0x0) {
        local_260 = local_6a0;
        if (local_6a0 != (void *)0x0) {
          free(local_6a0);
        }
      }
      else {
        (**(code **)(*local_680 + 0x18))(local_680,local_6a0);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_604;
}

Assistant:

static int convolution_im2col_gemm(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT_tileX;
    if (K > TILE_K)
    {
        topT_tileX.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT_tileX.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat topT_tile;
        if (K > TILE_K)
            topT_tile = topT_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = k + TILE_K >= K;

                convolution_gemm_transB_packed_tile(AT_tile, BT_tile, bias, topT_tile, top_blob, i, max_ii, j, max_jj, k, max_kk, k_end);
            }
        }
    }

    return 0;
}